

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

JsonArrayWriter * __thiscall Catch::JsonReporter::startArray(JsonReporter *this)

{
  _Elt_pointer pJVar1;
  JsonArrayWriter local_30;
  
  pJVar1 = (this->m_arrayWriters).c.
           super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_arrayWriters).c.
                super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_arrayWriters).c.
             super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonArrayWriter::writeArray(&local_30,pJVar1 + -1);
  std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::
  emplace_back<Catch::JsonArrayWriter>(&(this->m_arrayWriters).c,&local_30);
  JsonArrayWriter::~JsonArrayWriter(&local_30);
  local_30.m_os._0_4_ = 1;
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  emplace_back<Catch::JsonReporter::Writer>(&(this->m_writers).c,(Writer *)&local_30);
  pJVar1 = (this->m_arrayWriters).c.
           super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_arrayWriters).c.
                super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_arrayWriters).c.
             super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  return pJVar1 + -1;
}

Assistant:

JsonArrayWriter& JsonReporter::startArray() {
        m_arrayWriters.emplace( m_arrayWriters.top().writeArray() );
        m_writers.emplace( Writer::Array );
        return m_arrayWriters.top();
    }